

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void __thiscall
Catch::StreamingReporterBase<Catch::CompactReporter>::testRunStarting
          (StreamingReporterBase<Catch::CompactReporter> *this,TestRunInfo *_testRunInfo)

{
  LazyStat<Catch::TestRunInfo>::operator=(&this->currentTestRunInfo,_testRunInfo);
  return;
}

Assistant:

void testRunStarting(TestRunInfo const& _testRunInfo) override {
            currentTestRunInfo = _testRunInfo;
        }